

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluProgramInterfaceQuery.cpp
# Opt level: O2

void glu::getProgramResourceName
               (Functions *gl,deUint32 program,deUint32 programInterface,deUint32 index,string *dst)

{
  deUint32 dVar1;
  GLenum err;
  ostream *poVar2;
  TestError *this;
  string local_1c0;
  vector<char,_std::allocator<char>_> buf;
  
  dVar1 = getProgramResourceUint(gl,program,programInterface,index,0x92f9);
  if (0 < (int)dVar1) {
    std::vector<char,_std::allocator<char>_>::vector
              (&buf,(long)(int)(dVar1 + 1),(allocator_type *)&local_1c0);
    (*gl->getProgramResourceName)
              (program,programInterface,index,
               (int)buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
               (int)buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,(GLsizei *)0x0,
               buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
               _M_start);
    err = (*gl->getError)();
    checkError(err,"glGetProgramResourceName()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluProgramInterfaceQuery.cpp"
               ,0x31);
    std::__cxx11::string::assign((char *)dst);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&buf.super__Vector_base<char,_std::allocator<char>_>);
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&buf);
  poVar2 = std::operator<<((ostream *)&buf,"Empty name returned for ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2," at index ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  this = (TestError *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  tcu::TestError::TestError(this,&local_1c0);
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void getProgramResourceName (const glw::Functions& gl, deUint32 program, deUint32 programInterface, deUint32 index, std::string& dst)
{
	const int length = getProgramResourceInt(gl, program, programInterface, index, GL_NAME_LENGTH);

	if (length > 0)
	{
		std::vector<char> buf(length+1);
		gl.getProgramResourceName(program, programInterface, index, (int)buf.size(), DE_NULL, &buf[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramResourceName()");

		dst = (const char*)&buf[0];
	}
	else
	{
		std::ostringstream msg;
		msg << "Empty name returned for " << programInterface << " at index " << index;
		throw tcu::TestError(msg.str());
	}
}